

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  iterator iVar2;
  ostream *poVar3;
  undefined8 extraout_RAX;
  long *plVar4;
  char *pcVar5;
  int extraout_EDX;
  file_format format;
  int iVar6;
  uint uVar7;
  ifstream *input_stream;
  pair<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>,___gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  pVar8;
  output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  *local_4e0;
  value_t local_4d4;
  positional_arguments_t positional_arguments;
  compressed_lower_distance_matrix dist;
  named_arguments_t named_arguments;
  persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
  persistence_computer;
  cli_arguments_t arguments;
  vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>
  vietoris_rips_complex;
  ifstream file_stream;
  byte abStack_2e0 [488];
  flagser_parameters params;
  
  parse_arguments_abi_cxx11_(&arguments,argc,argv);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&positional_arguments,&arguments.first);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&named_arguments._M_h,&arguments.second._M_h);
  flagser_parameters::flagser_parameters(&params,&named_arguments);
  std::__cxx11::string::string((string *)&file_stream,"help",(allocator *)&persistence_computer);
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&named_arguments._M_h,(key_type *)&file_stream);
  std::__cxx11::string::~string((string *)&file_stream);
  if ((iVar2.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
       ._M_cur == (__node_type *)0x0) &&
     (positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string((string *)&file_stream,"format",(allocator *)&persistence_computer)
    ;
    iVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&named_arguments._M_h,(key_type *)&file_stream);
    std::__cxx11::string::~string((string *)&file_stream);
    format = DISTANCE_MATRIX;
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
        ._M_cur != (__node_type *)0x0) {
      pcVar5 = *(char **)((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                ._M_cur + 0x28);
      std::__cxx11::string::string
                ((string *)&file_stream,"lower-distance",(allocator *)&persistence_computer);
      bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&file_stream);
      std::__cxx11::string::~string((string *)&file_stream);
      format = LOWER_DISTANCE_MATRIX;
      if (!bVar1) {
        pcVar5 = *(char **)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                  ._M_cur + 0x28);
        std::__cxx11::string::string
                  ((string *)&file_stream,"upper-distance",(allocator *)&persistence_computer);
        bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&file_stream);
        std::__cxx11::string::~string((string *)&file_stream);
        if (bVar1) {
          format = UPPER_DISTANCE_MATRIX;
        }
        else {
          pcVar5 = *(char **)((long)iVar2.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                    ._M_cur + 0x28);
          std::__cxx11::string::string
                    ((string *)&file_stream,"distance",(allocator *)&persistence_computer);
          bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&file_stream);
          std::__cxx11::string::~string((string *)&file_stream);
          format = DISTANCE_MATRIX;
          if (!bVar1) {
            pcVar5 = *(char **)((long)iVar2.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                      ._M_cur + 0x28);
            std::__cxx11::string::string
                      ((string *)&file_stream,"point-cloud",(allocator *)&persistence_computer);
            bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&file_stream);
            std::__cxx11::string::~string((string *)&file_stream);
            if (bVar1) {
              format = POINT_CLOUD;
            }
            else {
              pcVar5 = *(char **)((long)iVar2.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
                                        ._M_cur + 0x28);
              std::__cxx11::string::string
                        ((string *)&file_stream,"dipha",(allocator *)&persistence_computer);
              bVar1 = std::operator==(pcVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&file_stream);
              std::__cxx11::string::~string((string *)&file_stream);
              if (!bVar1) goto LAB_0011d202;
              format = DIPHA;
            }
          }
        }
      }
    }
    local_4d4 = params.threshold;
    input_stream = &file_stream;
    std::ifstream::ifstream
              (input_stream,
               *positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                ._M_impl.super__Vector_impl_data._M_start,_S_in);
    if (*positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
         _M_impl.super__Vector_impl_data._M_start == (char *)0x0) {
      input_stream = (ifstream *)&std::cin;
    }
    else if ((abStack_2e0[*(long *)(_file_stream + -0x18)] & 5) != 0) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"couldn\'t open file ");
      poVar3 = std::operator<<(poVar3,*positional_arguments.
                                       super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(-1);
    }
    read_file(&dist,(istream *)input_stream,format);
    poVar3 = std::operator<<((ostream *)&std::cout,"distance matrix with ");
    iVar6 = (int)((ulong)((long)dist.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)dist.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar6);
    poVar3 = std::operator<<(poVar3," points");
    std::endl<char,std::char_traits<char>>(poVar3);
    pVar8 = std::
            __minmax_element<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (dist.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       dist.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    poVar3 = std::operator<<((ostream *)&std::cout,"value range: [");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pVar8.first._M_current._M_current);
    poVar3 = std::operator<<(poVar3,",");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pVar8.second._M_current._M_current);
    poVar3 = std::operator<<(poVar3,"]");
    std::endl<char,std::char_traits<char>>(poVar3);
    uVar7 = iVar6 - 2;
    if ((int)(uint)params.max_dimension <= (int)uVar7) {
      uVar7 = (uint)params.max_dimension;
    }
    vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    vietoris_rips_complex_t(&vietoris_rips_complex,&dist,(unsigned_short)uVar7,params.modulus);
    get_output<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>>>
              ((flagser_parameters *)&local_4e0);
    (*local_4e0->_vptr_output_t[2])(local_4e0,&vietoris_rips_complex);
    persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
    ::persistence_computer_t
              (&persistence_computer,&vietoris_rips_complex,local_4e0,params.max_entries,
               (int)params.modulus,local_4d4);
    persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
    ::compute_persistence(&persistence_computer,0,(unsigned_short)uVar7,false);
    (*local_4e0->_vptr_output_t[0xb])();
    persistence_computer_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
    ::~persistence_computer_t(&persistence_computer);
    if (local_4e0 !=
        (output_t<vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>_>
         *)0x0) {
      (*local_4e0->_vptr_output_t[1])();
    }
    vietoris_rips_complex_t<compressed_distance_matrix<(compressed_matrix_layout)0>_>::
    ~vietoris_rips_complex_t(&vietoris_rips_complex);
    compressed_distance_matrix<(compressed_matrix_layout)0>::~compressed_distance_matrix(&dist);
    std::ifstream::~ifstream(&file_stream);
    flagser_parameters::~flagser_parameters(&params);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&named_arguments._M_h);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
              );
    std::
    pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::~pair(&arguments);
  }
  else {
    print_usage_and_exit(-1);
LAB_0011d202:
    poVar3 = std::operator<<((ostream *)&std::cerr,"The input format ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,2);
    poVar3 = std::operator<<(poVar3," is not supported.");
    std::endl<char,std::char_traits<char>>(poVar3);
    print_usage_and_exit(-1);
    flagser_parameters::~flagser_parameters(&params);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&named_arguments._M_h);
    std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
              (&positional_arguments.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
              );
    std::
    pair<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>_>
    ::~pair(&arguments);
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar4 = (long *)__cxa_begin_catch(extraout_RAX);
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar3);
    __cxa_end_catch();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	file_format format = DISTANCE_MATRIX;

	index_t dim_max = 1;
	index_t dim_min = 0;
	value_t threshold = std::numeric_limits<value_t>::max();

#ifdef USE_COEFFICIENTS
	coefficient_t modulus = 2;
#else
	const coefficient_t modulus = 2;
#endif

	try {
		auto arguments = parse_arguments(argc, argv);
		auto positional_arguments = get_positional_arguments(arguments);
		auto named_arguments = get_named_arguments(arguments);
		auto params = flagser_parameters(named_arguments);

		if (named_arguments.find("help") != named_arguments.end()) { print_usage_and_exit(-1); }
		if (positional_arguments.size() == 0) print_usage_and_exit(-1);

		named_arguments_t::const_iterator it;
		if ((it = named_arguments.find("format")) != named_arguments.end()) {
			if (it->second == std::string("lower-distance"))
				format = LOWER_DISTANCE_MATRIX;
			else if (it->second == std::string("upper-distance"))
				format = UPPER_DISTANCE_MATRIX;
			else if (it->second == std::string("distance"))
				format = DISTANCE_MATRIX;
			else if (it->second == std::string("point-cloud"))
				format = POINT_CLOUD;
			else if (it->second == std::string("dipha"))
				format = DIPHA;
			else {
				std::cerr << "The input format " << format << " is not supported." << std::endl;
				print_usage_and_exit(-1);
			}
		}

		dim_max = params.max_dimension;
		threshold = params.threshold;

#ifdef USE_COEFFICIENTS
		modulus = params.modulus;
#endif

		size_t max_entries = std::numeric_limits<size_t>::max();
		max_entries = params.max_entries;

		std::ifstream file_stream(positional_arguments[0]);
		if (positional_arguments[0] && file_stream.fail()) {
			std::cerr << "couldn't open file " << positional_arguments[0] << std::endl;
			exit(-1);
		}

		compressed_lower_distance_matrix dist = read_file(positional_arguments[0] ? file_stream : std::cin, format);

		index_t n = index_t(dist.size());

		std::cout << "distance matrix with " << n << " points" << std::endl;

		auto value_range = std::minmax_element(dist.distances.begin(), dist.distances.end());
		std::cout << "value range: [" << *value_range.first << "," << *value_range.second << "]" << std::endl;

		dim_max = std::min(dim_max, n - 2);

		vietoris_rips_complex_t<decltype(dist)> vietoris_rips_complex(dist, dim_max, modulus);
		auto output = get_output<decltype(vietoris_rips_complex)>(params);
		output->set_complex(&vietoris_rips_complex);

		persistence_computer_t<decltype(vietoris_rips_complex)> persistence_computer(
		    vietoris_rips_complex, output.get(), max_entries, modulus, threshold);
		persistence_computer.compute_persistence(dim_min, dim_max, false);
		output->print_aggregated_results();
	} catch (const std::exception& e) { std::cout << e.what() << std::endl; }
}